

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cheaptrick.cc
# Opt level: O2

void sptk::world::InitializeCheapTrickOption(int fs,CheapTrickOption *option)

{
  int iVar1;
  
  option->q1 = -0.15;
  option->f0_floor = 71.0;
  iVar1 = GetFFTSizeForCheapTrick(fs,option);
  option->fft_size = iVar1;
  return;
}

Assistant:

void InitializeCheapTrickOption(int fs, CheapTrickOption *option) {
  // q1 is the parameter used for the spectral recovery.
  // Since The parameter is optimized, you don't need to change the parameter.
  option->q1 = -0.15;
  // f0_floor and fs are used to determine fft_size;
  // We strongly recommend not to change this value unless you have enough
  // knowledge of the signal processing in CheapTrick.
  option->f0_floor = world::kFloorF0;
  option->fft_size = GetFFTSizeForCheapTrick(fs, option);
}